

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O0

void __thiscall clickhouse::ColumnEnum<short>::Append(ColumnEnum<short> *this,ColumnRef *column)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  iterator this_00;
  Column *in_RSI;
  shared_ptr<clickhouse::ColumnEnum<short>_> col;
  vector<short,_std::allocator<short>_> *in_stack_ffffffffffffff78;
  __normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_>
  *in_stack_ffffffffffffff80;
  const_iterator in_stack_ffffffffffffffd8;
  __shared_ptr local_20 [32];
  
  std::__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1f9443);
  Column::As<clickhouse::ColumnEnum<short>>(in_RSI);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_20);
  if (bVar1) {
    __first = std::vector<short,_std::allocator<short>_>::end(in_stack_ffffffffffffff78);
    __gnu_cxx::__normal_iterator<short_const*,std::vector<short,std::allocator<short>>>::
    __normal_iterator<short*>
              (in_stack_ffffffffffffff80,
               (__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> *)
               in_stack_ffffffffffffff78);
    std::
    __shared_ptr_access<clickhouse::ColumnEnum<short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<clickhouse::ColumnEnum<short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1f9499);
    __last = std::vector<short,_std::allocator<short>_>::begin(in_stack_ffffffffffffff78);
    std::
    __shared_ptr_access<clickhouse::ColumnEnum<short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<clickhouse::ColumnEnum<short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1f94b4);
    this_00 = std::vector<short,_std::allocator<short>_>::end(in_stack_ffffffffffffff78);
    std::vector<short,std::allocator<short>>::
    insert<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>,void>
              ((vector<short,_std::allocator<short>_> *)this_00._M_current,in_stack_ffffffffffffffd8
               ,(__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>)
                __first._M_current,
               (__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>)
               __last._M_current);
  }
  std::shared_ptr<clickhouse::ColumnEnum<short>_>::~shared_ptr
            ((shared_ptr<clickhouse::ColumnEnum<short>_> *)0x1f9515);
  return;
}

Assistant:

void ColumnEnum<T>::Append(ColumnRef column) {
    if (auto col = column->As<ColumnEnum<T>>()) {
        data_.insert(data_.end(), col->data_.begin(), col->data_.end());
    }
}